

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

classification mjs::anon_unknown_2::classify(uint32_t ch)

{
  uint uVar1;
  runtime_error *this;
  int local_2c;
  uint32_t index;
  uint32_t high;
  uint32_t low;
  int asize;
  uint32_t ch_local;
  
  if (ch < (uint)0xe01f0) {
    if (ch == 0xe01ef) {
      asize._3_1_ = id_part;
    }
    else {
      index = 0;
      local_2c = 0x51d;
      while( true ) {
        while (uVar1 = index + (local_2c - index >> 1),
              ch < *(uint *)(unicode::classification_run_start + (ulong)uVar1 * 4)) {
          local_2c = uVar1 - 1;
        }
        if (ch < *(uint *)(unicode::classification_run_start + (ulong)(uVar1 + 1) * 4)) break;
        index = uVar1 + 1;
      }
      asize._3_1_ = unicode::classification_run_type[uVar1];
    }
    return asize._3_1_;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Unicode character out of range");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr unicode::classification classify(const uint32_t ch) {
    constexpr auto asize = static_cast<int>(sizeof(unicode::classification_run_start)/sizeof(*unicode::classification_run_start));
    if (ch > unicode::classification_run_start[asize-1]) {
        throw std::runtime_error("Unicode character out of range");
    } else if (ch == unicode::classification_run_start[asize-1]) {
        // Very unlikely
        return unicode::classification_run_type[asize-1];
    }    
    for (uint32_t low = 0, high = asize-1;;) {
        const uint32_t index = low + (high-low) / 2;
        if (ch < unicode::classification_run_start[index]) {
            high = index - 1;
        } else if (ch >= unicode::classification_run_start[index+1]) {
            low = index + 1;
        } else {
            return unicode::classification_run_type[index];
        }
    }
}